

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseConnection.cpp
# Opt level: O0

void __thiscall tonk::Connection::OnICMPError(Connection *this,error_code *error)

{
  undefined8 *in_RSI;
  type *in_RDI;
  
  std::unique_ptr<asio::io_context::strand,_std::default_delete<asio::io_context::strand>_>::
  operator->((unique_ptr<asio::io_context::strand,_std::default_delete<asio::io_context::strand>_> *
             )0x138e84);
  asio::io_context::strand::post<tonk::Connection::OnICMPError(std::error_code_const&)::__0>
            ((strand *)*in_RSI,in_RDI);
  return;
}

Assistant:

void Connection::OnICMPError(const asio::error_code& error)
{
    AsioEventStrand->post([this, error]()
    {
        const bool isOutgoingConnection = (ResolverState != nullptr);

        /*
            IF Connection Was Established
            OR This Was NOT The Connection Initiator
            THEN
                Disconnect asychronously with network failure error
            ELSE
                This is a client trying to connect given hostname,
                so try the next hostname.
            END IF
        */
        if (ConnectionEstablished || !isOutgoingConnection)
        {
            SelfRefCount.StartShutdown(Tonk_NetworkFailed,
                Result("Connection::OnICMPError",
                    error.message(),
                    ErrorType::Asio,
                    error.value()));
        }
        else
        {
            Logger.Debug("Selecting next server to connect to");

            // This is a client trying to connect given hostname,
            // so try the next hostname.
            startConnectingToNextAddress();
        }

        SelfRefCount.DecrementReferences();
    });
}